

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdKelvinMaterialShininessE::emulate_mthd(MthdKelvinMaterialShininessE *this)

{
  MthdKelvinMaterialShininessE *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type == 0x20) {
      pgraph_ld_ltc(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2,
                    this->side + 3,(this->super_SingleMthdTest).super_MthdTest.val);
    }
    else {
      pgraph_ld_ltc(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2,
                    this->side + 3,(this->super_SingleMthdTest).super_MthdTest.val);
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (!exp.nsource) {
			if (chipset.card_type == 0x20)
				pgraph_ld_ltc(&exp, 2, 0x03 + side, val);
			else
				pgraph_ld_ltc(&exp, 2, 0x03 + side, val);
		}
	}